

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunay.c
# Opt level: O2

DTDrawingParameters *
initDTDrawingParameters
          (DelaunayTriangulation *delTri,bov_window_t *window,GLfloat (*linesPoints) [2],
          bov_points_t *pointsDraw,bov_points_t *activePointsDraw,bov_points_t *linesDraw,
          GLfloat (*bounds) [2],int FAST,int sleep)

{
  uint uVar1;
  double dVar2;
  int iVar3;
  DTDrawingParameters *pDVar4;
  GLfloat (*coords) [2];
  bov_points_t *pbVar5;
  char *pcVar6;
  bov_order_t *pbVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  GLfloat local_68 [14];
  
  pDVar4 = (DTDrawingParameters *)malloc(0x6d0);
  pDVar4->delTri = delTri;
  pDVar4->window = window;
  pDVar4->linesPoints = linesPoints;
  pDVar4->pointsDraw = pointsDraw;
  pDVar4->activePointsDraw = activePointsDraw;
  pDVar4->linesDraw = linesDraw;
  pDVar4->FAST = FAST;
  pDVar4->sleep = sleep;
  pDVar4->draw_circle = 1;
  fVar9 = bounds[1][1];
  fVar10 = fVar9 - (*bounds)[1];
  pDVar4->y_min = fVar10 * -0.25 + (*bounds)[1];
  pDVar4->y_max = fVar10 * 0.25 + fVar9;
  pDVar4->n_divides = 0;
  uVar1 = delTri->n_points;
  iVar3 = (int)uVar1 >> 1;
  pDVar4->n_divides_max = iVar3;
  coords = (GLfloat (*) [2])malloc((long)iVar3 << 4);
  pDVar4->divideLinesPoints = coords;
  pbVar5 = bov_points_new(coords,uVar1 & 0xfffffffe,0x88e4);
  pDVar4->divideLinesDraw = pbVar5;
  pcVar6 = (char *)calloc((long)iVar3,1);
  pDVar4->divideLinesMask = pcVar6;
  local_68[8] = 1.0;
  local_68[9] = 0.0;
  local_68[10] = 0.0;
  local_68[0xb] = 0.8;
  bov_points_set_color(pbVar5,local_68 + 8);
  (pbVar5->param).width = 0.002;
  fVar9 = 0.0;
  for (lVar8 = 6; lVar8 != 0x6a; lVar8 = lVar8 + 1) {
    dVar2 = cos((double)fVar9);
    pDVar4->cos_[lVar8 + -6] = (float)dVar2;
    dVar2 = sin((double)fVar9);
    pDVar4->sin_[lVar8 + -6] = (float)dVar2;
    fVar9 = fVar9 + 0.06283186;
  }
  pbVar5 = bov_points_new(delTri->points,delTri->n_points,0x88e4);
  pDVar4->searchPointsDraw = pbVar5;
  pbVar5 = bov_points_new(pDVar4->circ,100,0x88e4);
  pDVar4->circlePointsDraw = pbVar5;
  pbVar7 = bov_order_new((GLuint *)pDVar4->searchPoints,3,0x88e4);
  pDVar4->searchPointsOrder = pbVar7;
  local_68[4] = 0.0;
  local_68[5] = 0.565;
  local_68[6] = 0.901;
  local_68[7] = 1.0;
  bov_points_set_color(pDVar4->searchPointsDraw,local_68 + 4);
  (pDVar4->searchPointsDraw->param).width = 0.015;
  local_68[0] = 0.0;
  local_68[1] = 0.565;
  local_68[2] = 0.901;
  local_68[3] = 1.0;
  bov_points_set_color(pDVar4->circlePointsDraw,local_68);
  (pDVar4->circlePointsDraw->param).width = 0.004;
  return pDVar4;
}

Assistant:

DTDrawingParameters* initDTDrawingParameters(DelaunayTriangulation *delTri,
											 bov_window_t *window,
						 					 GLfloat linesPoints[][2],
						 					 bov_points_t *pointsDraw,
											 bov_points_t *activePointsDraw,
											 bov_points_t *linesDraw,
											 GLfloat bounds[][2],
						 					 int FAST, int sleep) {

	DTDrawingParameters *DTDparams = malloc(sizeof(DTDrawingParameters));
	DTDparams->delTri = delTri;
	DTDparams->window = window;
	DTDparams->linesPoints = linesPoints;
	DTDparams->pointsDraw = pointsDraw;
	DTDparams->activePointsDraw = activePointsDraw;
	DTDparams->linesDraw = linesDraw;
	DTDparams->FAST = FAST;
	DTDparams->sleep = sleep;
	DTDparams->draw_circle = 1;

	GLfloat dy = bounds[1][1] - bounds[0][1];

	DTDparams->y_min = bounds[0][1] - 0.25 * dy;
	DTDparams->y_max = bounds[1][1] + 0.25 * dy;

	DTDparams->n_divides = 0;
	DTDparams->n_divides_max = delTri->n_points >> 1;

	DTDparams->divideLinesPoints = malloc(sizeof(DTDparams->divideLinesPoints[0]) * DTDparams->n_divides_max * 2);
	DTDparams->divideLinesDraw = bov_points_new(DTDparams->divideLinesPoints, DTDparams->n_divides_max * 2, GL_STATIC_DRAW);
	DTDparams->divideLinesMask = calloc(DTDparams->n_divides_max, sizeof(char));

	bov_points_set_color(DTDparams->divideLinesDraw, DIVIDE_LINES_COLOR);
	bov_points_set_width(DTDparams->divideLinesDraw, DIVIDE_LINES_WIDTH);

	GLfloat dtheta = 2 * M_PI / (GLfloat) N_POINTS;
	GLfloat theta = 0.0;

	for (GLsizei i = 0; i < N_POINTS; i++) {
		DTDparams->cos_[i] = cos(theta);
		DTDparams->sin_[i] = sin(theta);

		theta += dtheta;
	}

	DTDparams->searchPointsDraw = bov_points_new(DTDparams->delTri->points, DTDparams->delTri->n_points, GL_STATIC_DRAW);
	DTDparams->circlePointsDraw = bov_points_new(DTDparams->circ, N_POINTS, GL_STATIC_DRAW);
	DTDparams->searchPointsOrder = bov_order_new(DTDparams->searchPoints, 3, GL_STATIC_DRAW);

	bov_points_set_color(DTDparams->searchPointsDraw, SEARCHED_POINTS_COLOR);
	bov_points_set_width(DTDparams->searchPointsDraw, SEARCHED_POINTS_WIDTH);
	bov_points_set_color(DTDparams->circlePointsDraw, CIRCLE_LINES_COLOR);
	bov_points_set_width(DTDparams->circlePointsDraw, CIRCLE_LINES_WIDTH);

	return DTDparams;
}